

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  bool bVar1;
  reference ppcVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  reference ppcVar3;
  cmLocalGenerator *pcVar4;
  cmTargetDepend local_98;
  cmGeneratorTarget *local_78;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *tgts;
  cmLocalGenerator *generator;
  const_iterator __end1;
  const_iterator __begin1;
  GeneratorVector *__range1;
  GeneratorVector *generators_local;
  cmLocalGenerator *root_local;
  TargetDependSet *originalTargets_local;
  TargetDependSet *projectTargets_local;
  cmGlobalGenerator *this_local;
  
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(generators);
  generator = (cmLocalGenerator *)
              std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(generators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&generator), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    pcVar4 = *ppcVar2;
    bVar1 = IsExcluded(this,root,pcVar4);
    if (!bVar1) {
      this_00 = cmLocalGenerator::GetGeneratorTargets(pcVar4);
      __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                         (this_00);
      target = (cmGeneratorTarget *)
               std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                         *)&target), bVar1) {
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&__end2);
        local_78 = *ppcVar3;
        bVar1 = IsRootOnlyTarget(this,local_78);
        if ((!bVar1) || (pcVar4 = cmGeneratorTarget::GetLocalGenerator(local_78), pcVar4 == root)) {
          cmTargetDepend::cmTargetDepend(&local_98,local_78);
          std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
          insert(&originalTargets->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 ,&local_98);
          cmTargetDepend::~cmTargetDepend(&local_98);
          AddTargetDepends(this,local_78,projectTargets);
        }
        __gnu_cxx::
        __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
        ::operator++(&__end2);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for (cmLocalGenerator* generator : generators) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, generator)) {
      continue;
    }
    // Get the targets in the makefile
    const std::vector<cmGeneratorTarget*>& tgts =
      generator->GetGeneratorTargets();
    // loop over all the targets
    for (cmGeneratorTarget* target : tgts) {
      if (this->IsRootOnlyTarget(target) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
    }
  }
}